

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O3

void __thiscall
CTPNStmProg::build_object_file(CTPNStmProg *this,CVmFile *object_fp,CTcMake *make_obj)

{
  int iVar1;
  
  iVar1 = gen_code_for_build(this);
  if (iVar1 != 0) {
    return;
  }
  CTcGenTarg::write_to_object_file(G_cg,object_fp,make_obj);
  return;
}

Assistant:

void CTPNStmProg::build_object_file(class CVmFile *object_fp,
                                    class CTcMake *make_obj)
{
    /* generate code */
    if (gen_code_for_build())
        return;

    /*
     *   Finally, our task of constructing the program is complete.  All
     *   that remains is to write the image file.  Tell the code generator
     *   to begin the process.  
     */
    G_cg->write_to_object_file(object_fp, make_obj);
}